

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_create_collation_v2
              (sqlite3 *db,char *zName,int enc,void *pCtx,
              _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare,_func_void_void_ptr *xDel)

{
  int iVar1;
  int rc;
  _func_void_void_ptr *xDel_local;
  _func_int_void_ptr_int_void_ptr_int_void_ptr *xCompare_local;
  void *pCtx_local;
  int enc_local;
  char *zName_local;
  sqlite3 *db_local;
  
  sqlite3_mutex_enter(db->mutex);
  iVar1 = createCollation(db,zName,(u8)enc,pCtx,xCompare,xDel);
  iVar1 = sqlite3ApiExit(db,iVar1);
  sqlite3_mutex_leave(db->mutex);
  return iVar1;
}

Assistant:

SQLITE_API int sqlite3_create_collation_v2(
  sqlite3* db,
  const char *zName,
  int enc,
  void* pCtx,
  int(*xCompare)(void*,int,const void*,int,const void*),
  void(*xDel)(void*)
){
  int rc;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zName==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  assert( !db->mallocFailed );
  rc = createCollation(db, zName, (u8)enc, pCtx, xCompare, xDel);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}